

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O3

Stmt * __thiscall kratos::Stmt::stmt_parent(Stmt *this)

{
  int iVar1;
  undefined4 extraout_var;
  Stmt *pSVar2;
  uint uVar3;
  
  pSVar2 = (Stmt *)this->parent_;
  if ((pSVar2 != (Stmt *)0x0) && ((pSVar2->super_IRNode).ast_node_type_ == StmtKind)) {
    uVar3 = 0;
    do {
      this = pSVar2;
      iVar1 = (*(this->super_IRNode)._vptr_IRNode[4])(this);
      pSVar2 = (Stmt *)CONCAT44(extraout_var,iVar1);
      if ((0x1869e < uVar3) || (pSVar2 == (Stmt *)0x0)) break;
      uVar3 = uVar3 + 1;
    } while ((pSVar2->super_IRNode).ast_node_type_ == StmtKind);
  }
  pSVar2 = (Stmt *)__dynamic_cast(this,&IRNode::typeinfo,&typeinfo,0);
  return pSVar2;
}

Assistant:

Stmt *Stmt::stmt_parent() const {
    const IRNode *p = parent_;
    const IRNode *pre = this;
    for (uint32_t i = 0; i < 100000u && p; i++) {
        if (p->ir_node_kind() == IRNodeKind::StmtKind) {
            pre = p;
            p = p->parent();
        } else {
            break;
        }
    }
    return dynamic_cast<Stmt *>(const_cast<IRNode *>(pre));
}